

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.c
# Opt level: O0

double LambertW(double z)

{
  double in_XMM0_Qa;
  double dVar1;
  double dw;
  double expmw;
  double lnz;
  int i;
  double w;
  double local_38;
  uint local_1c;
  double local_18;
  double local_8;
  
  if (in_XMM0_Qa + 0.36787944117144233 < -2.220446049250313e-15) {
    fprintf(_stderr,"Error - Lambert function called with argument z = %e.\n",in_XMM0_Qa);
    exit(1);
  }
  if (-0.36787944117144233 <= in_XMM0_Qa) {
    dVar1 = cbrt(2.220446049250313e-16);
    if (dVar1 <= ABS(in_XMM0_Qa)) {
      if (-0.3140862435046707 < in_XMM0_Qa) {
        if (1.149876485041417 < in_XMM0_Qa) {
          local_18 = log(in_XMM0_Qa);
          dVar1 = log(local_18);
          local_18 = local_18 - dVar1;
        }
        else {
          local_18 = in_XMM0_Qa * 1.5 * in_XMM0_Qa * in_XMM0_Qa +
                     -in_XMM0_Qa * in_XMM0_Qa + in_XMM0_Qa;
        }
      }
      else {
        local_18 = sqrt(in_XMM0_Qa * 5.43656365691809 + 2.0);
        local_18 = local_18 - 1.0;
      }
      for (local_1c = 0; (int)local_1c < 0xf; local_1c = local_1c + 1) {
        dVar1 = exp(-local_18);
        if ((local_18 != -1.0) || (NAN(local_18))) {
          local_38 = -(-in_XMM0_Qa * dVar1 + local_18) /
                     (-((local_18 + 2.0) / (local_18 + local_18 + 2.0)) *
                      (-in_XMM0_Qa * dVar1 + local_18) + local_18 + 1.0);
        }
        else {
          local_38 = 0.0;
        }
        local_18 = local_38 + local_18;
        if (ABS(local_38) < (ABS(local_18) + 1.0) * 2.220446049250313e-14) {
          return local_18;
        }
      }
      fprintf(_stderr,"lambert_w: iteration limit i=%i reached for z= %.16e\nShould never happen!\n"
              ,in_XMM0_Qa,(ulong)local_1c);
      local_8 = 0.0;
    }
    else {
      local_8 = in_XMM0_Qa * 1.5 * in_XMM0_Qa * in_XMM0_Qa + -in_XMM0_Qa * in_XMM0_Qa + in_XMM0_Qa;
    }
  }
  else {
    local_8 = -1.0;
  }
  return local_8;
}

Assistant:

GPU_FUNCTION double LambertW(double z)
{
  double w;
  int i;

  /* Sanity check - function is only defined for z >= -1/e */
  if(z + 1.0/M_E < -10*DBL_EPSILON) {
#ifndef HAVE_CUDA
    fprintf(stderr,"Error - Lambert function called with argument z = %e.\n",z);
    exit(1);
#endif
  } else if(z < -1.0/M_E)
    /* Value of W(x) at x=-1/e is -1 */
    return -1.0;

  /* If z is small, go with the first terms of the power expansion
     (if z smaller than cube root of epsilon, z^4 will be zero to
     machine precision).
   */
  if(fabs(z) < CBRT(DBL_EPSILON))
    return z - z*z + 1.5*z*z*z;

  /* Initial guess. */
  if(z <= -0.3140862435046707) { /* Point where sqrt and Taylor polynomials match */
    /* Near the branching point: first terms in eqn (4.22) */
    w = sqrt(2.0*M_E*z + 2.0) - 1.0;

  } else if(z <= 1.149876485041417) { /* Point where Taylor and log expansion match */

    /* Taylor series around origin */
    w = z - z*z + 1.5*z*z*z;

  } else {
    /* Asymptotic expansion */
    double lnz = log(z);

    w = lnz - log(lnz);
  }

  /* Find result through iteration */
  for(i=0; i<15; i++){
    double expmw, dw;
    expmw = exp(-w);

    /* Halley's equation, (5.9) in Corless et al */
    if( w != -1.0 )
      dw = - (w - z*expmw) / ( w + 1.0 - (w + 2.0)/(2.0*w + 2.0)*(w - z*expmw) );
    else
      dw = 0.0;

    w += dw;
    if(fabs(dw) < 100*DBL_EPSILON*(1.0 + fabs(w)))
      return w;
  }

#ifndef HAVE_CUDA
  /* This should never happen! */
  fprintf(stderr, "lambert_w: iteration limit i=%i reached for z= %.16e\nShould never happen!\n", i, z);
#endif

  return 0.0;
}